

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cc
# Opt level: O0

void xLearn::check(DMatrix *matrix,bool has_label,bool has_field)

{
  bool bVar1;
  char *pcVar2;
  const_reference ppvVar3;
  size_type sVar4;
  byte in_DL;
  byte in_SIL;
  long in_RDI;
  AssertionResult gtest_ar_9;
  float in_stack_00000118;
  float in_stack_0000011c;
  char *in_stack_00000120;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  iterator iter;
  int n;
  SparseRow *row;
  AssertionResult gtest_ar_4;
  int col_len;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  index_t i;
  AssertionResult gtest_ar;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *in_stack_fffffffffffffd58;
  AssertionResult *in_stack_fffffffffffffd60;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  char *in_stack_fffffffffffffd70;
  AssertionResult *in_stack_fffffffffffffd78;
  AssertHelper local_1b8;
  Message local_1b0;
  undefined4 local_1a4;
  AssertionResult local_1a0;
  AssertHelper local_190;
  Message local_188;
  AssertionResult local_180;
  AssertHelper local_170;
  Message local_168;
  AssertionResult local_160;
  AssertHelper local_150;
  Message local_148;
  undefined4 local_13c;
  AssertionResult local_138;
  AssertHelper local_128;
  Message local_120;
  AssertionResult local_118;
  Node *local_108;
  __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_100;
  int local_f4;
  value_type local_f0;
  AssertHelper local_e8;
  Message local_e0;
  undefined4 local_d4;
  AssertionResult local_d0;
  undefined4 local_bc;
  AssertHelper local_b8;
  Message local_b0;
  AssertionResult local_a8;
  AssertHelper local_98;
  Message local_90;
  undefined4 local_84;
  AssertionResult local_80;
  AssertHelper local_70;
  Message local_68;
  undefined4 local_5c;
  AssertionResult local_58;
  uint local_44;
  AssertHelper local_40;
  Message local_38 [3];
  AssertionResult local_20;
  byte local_a;
  byte local_9;
  long local_8;
  
  local_9 = in_SIL & 1;
  local_a = in_DL & 1;
  local_8 = in_RDI;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            (&in_stack_fffffffffffffd78->success_,in_stack_fffffffffffffd70,
             (uint *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
             (uint *)in_stack_fffffffffffffd60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message(local_38);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x14761a);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
               ,0x38,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::Message::~Message((Message *)0x14767d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1476d5);
  for (local_44 = 0; local_44 < *(uint *)(local_8 + 0x10); local_44 = local_44 + 1) {
    if ((local_9 & 1) == 0) {
      std::vector<float,_std::allocator<float>_>::operator[]
                ((vector<float,_std::allocator<float>_> *)(local_8 + 0x30),(ulong)local_44);
      local_84 = 0xfffffffe;
      testing::internal::EqHelper<false>::Compare<float,int>
                (&in_stack_fffffffffffffd78->success_,in_stack_fffffffffffffd70,
                 (float *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                 (int *)in_stack_fffffffffffffd60);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_80);
      if (!bVar1) {
        testing::Message::Message(&local_90);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x147947);
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                   ,0x3d,pcVar2);
        testing::internal::AssertHelper::operator=(&local_98,&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        testing::Message::~Message((Message *)0x1479aa);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1479ff);
    }
    else {
      std::vector<float,_std::allocator<float>_>::operator[]
                ((vector<float,_std::allocator<float>_> *)(local_8 + 0x30),(ulong)local_44);
      local_5c = 1;
      testing::internal::EqHelper<false>::Compare<float,int>
                (&in_stack_fffffffffffffd78->success_,in_stack_fffffffffffffd70,
                 (float *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                 (int *)in_stack_fffffffffffffd60);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_58);
      if (!bVar1) {
        testing::Message::Message(&local_68);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1477c8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                   ,0x3b,pcVar2);
        testing::internal::AssertHelper::operator=(&local_70,&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_70);
        testing::Message::~Message((Message *)0x14782b);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x147880);
    }
    std::vector<float,_std::allocator<float>_>::operator[]
              ((vector<float,_std::allocator<float>_> *)(local_8 + 0x48),(ulong)local_44);
    testing::internal::CmpHelperFloatingPointEQ<float>
              ((char *)gtest_ar_8._0_8_,in_stack_00000120,in_stack_0000011c,in_stack_00000118);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a8);
    if (!bVar1) {
      testing::Message::Message(&local_b0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x147ab9);
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                 ,0x3f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      testing::Message::~Message((Message *)0x147b1c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x147b74);
    ppvVar3 = std::
              vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
              ::operator[]((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                            *)(local_8 + 0x18),(ulong)local_44);
    sVar4 = std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::size(*ppvVar3);
    local_bc = (undefined4)sVar4;
    local_d4 = 5;
    testing::internal::EqHelper<false>::Compare<int,int>
              (&in_stack_fffffffffffffd78->success_,in_stack_fffffffffffffd70,
               (int *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
               (int *)in_stack_fffffffffffffd60);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d0);
    if (!bVar1) {
      testing::Message::Message(&local_e0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x147c4a);
      testing::internal::AssertHelper::AssertHelper
                (&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                 ,0x41,pcVar2);
      testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
      testing::internal::AssertHelper::~AssertHelper(&local_e8);
      testing::Message::~Message((Message *)0x147ca7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x147cff);
    ppvVar3 = std::
              vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
              ::operator[]((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                            *)(local_8 + 0x18),(ulong)local_44);
    local_f0 = *ppvVar3;
    local_f4 = 0;
    local_100._M_current =
         (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin
                           (in_stack_fffffffffffffd58);
    while( true ) {
      local_108 = (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end
                                    (in_stack_fffffffffffffd58);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                          *)in_stack_fffffffffffffd60,
                         (__normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                          *)in_stack_fffffffffffffd58);
      if (!bVar1) break;
      if ((local_a & 1) == 0) {
        __gnu_cxx::
        __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
        ::operator->(&local_100);
        local_13c = 0;
        testing::internal::EqHelper<false>::Compare<unsigned_int,int>
                  (&in_stack_fffffffffffffd78->success_,in_stack_fffffffffffffd70,
                   (uint *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                   (int *)in_stack_fffffffffffffd60);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_138);
        if (!bVar1) {
          testing::Message::Message(&local_148);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x147f83);
          testing::internal::AssertHelper::AssertHelper
                    (&local_150,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                     ,0x49,pcVar2);
          testing::internal::AssertHelper::operator=(&local_150,&local_148);
          testing::internal::AssertHelper::~AssertHelper(&local_150);
          testing::Message::~Message((Message *)0x147fe0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x148035);
      }
      else {
        __gnu_cxx::
        __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
        ::operator->(&local_100);
        testing::internal::EqHelper<false>::Compare<unsigned_int,int>
                  (&in_stack_fffffffffffffd78->success_,in_stack_fffffffffffffd70,
                   (uint *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                   (int *)in_stack_fffffffffffffd60);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_118);
        if (!bVar1) {
          testing::Message::Message(&local_120);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x147e23);
          testing::internal::AssertHelper::AssertHelper
                    (&local_128,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                     ,0x47,pcVar2);
          testing::internal::AssertHelper::operator=(&local_128,&local_120);
          testing::internal::AssertHelper::~AssertHelper(&local_128);
          testing::Message::~Message((Message *)0x147e80);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x147ed5);
      }
      __gnu_cxx::
      __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>::
      operator->(&local_100);
      testing::internal::EqHelper<false>::Compare<unsigned_int,int>
                (&in_stack_fffffffffffffd78->success_,in_stack_fffffffffffffd70,
                 (uint *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                 (int *)in_stack_fffffffffffffd60);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_160);
      if (!bVar1) {
        testing::Message::Message(&local_168);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1480d9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_170,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                   ,0x4b,pcVar2);
        testing::internal::AssertHelper::operator=(&local_170,&local_168);
        testing::internal::AssertHelper::~AssertHelper(&local_170);
        testing::Message::~Message((Message *)0x148136);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x14818b);
      __gnu_cxx::
      __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>::
      operator->(&local_100);
      in_stack_fffffffffffffd78 = &local_180;
      testing::internal::CmpHelperFloatingPointEQ<float>
                ((char *)gtest_ar_8._0_8_,in_stack_00000120,in_stack_0000011c,in_stack_00000118);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffd78);
      if (!bVar1) {
        testing::Message::Message(&local_188);
        in_stack_fffffffffffffd70 =
             testing::AssertionResult::failure_message((AssertionResult *)0x14822b);
        testing::internal::AssertHelper::AssertHelper
                  (&local_190,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                   ,0x4c,in_stack_fffffffffffffd70);
        testing::internal::AssertHelper::operator=(&local_190,&local_188);
        testing::internal::AssertHelper::~AssertHelper(&local_190);
        testing::Message::~Message((Message *)0x148288);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1482dd);
      local_f4 = local_f4 + 1;
      __gnu_cxx::
      __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>::
      operator++(&local_100);
    }
    local_1a4 = 5;
    in_stack_fffffffffffffd60 = &local_1a0;
    testing::internal::EqHelper<false>::Compare<int,int>
              (&in_stack_fffffffffffffd78->success_,in_stack_fffffffffffffd70,
               (int *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
               (int *)in_stack_fffffffffffffd60);
    in_stack_fffffffffffffd6f =
         testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffd60);
    if (!(bool)in_stack_fffffffffffffd6f) {
      testing::Message::Message(&local_1b0);
      in_stack_fffffffffffffd58 =
           (vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)
           testing::AssertionResult::failure_message((AssertionResult *)0x1483a1);
      testing::internal::AssertHelper::AssertHelper
                (&local_1b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                 ,0x4f,(char *)in_stack_fffffffffffffd58);
      testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
      testing::internal::AssertHelper::~AssertHelper(&local_1b8);
      testing::Message::~Message((Message *)0x1483fc);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x148451);
  }
  return;
}

Assistant:

void check(const DMatrix& matrix, bool has_label, bool has_field) {
  EXPECT_EQ(matrix.row_length, kNum_lines);
  for (index_t i = 0; i < matrix.row_length; ++i) {
    if (has_label) {
      EXPECT_EQ(matrix.Y[i], 1);
    } else {
      EXPECT_EQ(matrix.Y[i], -2);
    }
    EXPECT_FLOAT_EQ(matrix.norm[i], 13.888889);
    int col_len = matrix.row[i]->size();
    EXPECT_EQ(col_len, 5);
    SparseRow *row = matrix.row[i];
    int n = 0;
    for (SparseRow::iterator iter = row->begin();
         iter != row->end(); ++iter) {
      if (has_field) {
        EXPECT_EQ(iter->field_id, n);
      } else {
        EXPECT_EQ(iter->field_id, 0);
      }
      EXPECT_EQ(iter->feat_id, n);
      EXPECT_FLOAT_EQ(iter->feat_val, 0.12);
      n++;
    }
    EXPECT_EQ(n, 5);
  }
}